

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void print_props(connection *conn,char *uri,file_stat_t *stp)

{
  tm *__tp;
  char *pcVar1;
  char mtime [64];
  char acStack_68 [72];
  
  __tp = gmtime(&stp->st_mtime);
  strftime(acStack_68,0x40,"%a, %d %b %Y %H:%M:%S GMT",__tp);
  pcVar1 = "";
  if ((stp->st_mode & 0xf000) == 0x4000) {
    pcVar1 = "<d:collection/>";
  }
  mg_printf(&conn->mg_conn,
            "<d:response><d:href>%s</d:href><d:propstat><d:prop><d:resourcetype>%s</d:resourcetype><d:getcontentlength>%ld</d:getcontentlength><d:getlastmodified>%s</d:getlastmodified></d:prop><d:status>HTTP/1.1 200 OK</d:status></d:propstat></d:response>\n"
            ,uri,pcVar1,stp->st_size,acStack_68);
  return;
}

Assistant:

static void print_props(struct connection *conn, const char *uri,
                        file_stat_t *stp) {
  char mtime[64];

  gmt_time_string(mtime, sizeof(mtime), &stp->st_mtime);
  mg_printf(&conn->mg_conn,
      "<d:response>"
       "<d:href>%s</d:href>"
       "<d:propstat>"
        "<d:prop>"
         "<d:resourcetype>%s</d:resourcetype>"
         "<d:getcontentlength>%" INT64_FMT "</d:getcontentlength>"
         "<d:getlastmodified>%s</d:getlastmodified>"
        "</d:prop>"
        "<d:status>HTTP/1.1 200 OK</d:status>"
       "</d:propstat>"
      "</d:response>\n",
      uri, S_ISDIR(stp->st_mode) ? "<d:collection/>" : "",
      (int64_t) stp->st_size, mtime);
}